

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O2

void __thiscall
Diligent::QueryManagerVk::QueryManagerVk
          (QueryManagerVk *this,RenderDeviceVkImpl *pRenderDeviceVk,Uint32 *QueryHeapSizes,
          SoftwareQueueIndex CmdQueueInd)

{
  uint uVar1;
  VulkanPhysicalDevice *pVVar2;
  VulkanLogicalDevice *LogicalDevice;
  long lVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  ICommandQueueVk *pIVar7;
  long lVar8;
  uint uVar9;
  char (*Args_1) [108];
  QueryPoolInfo *this_00;
  QUERY_TYPE Type;
  ulong uVar10;
  HardwareQueueIndex QueueFamilyIndex;
  string msg;
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> local_8d;
  int local_8c;
  VkQueryPoolCreateInfo local_88;
  array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL> *local_68;
  RenderDeviceVkImpl *local_60;
  Uint32 *local_58;
  string local_50;
  
  (this->m_CommandQueueId).m_Value = CmdQueueInd.m_Value;
  local_68 = &this->m_Pools;
  local_58 = QueryHeapSizes;
  std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::array(local_68);
  pVVar2 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  LogicalDevice =
       (pRenderDeviceVk->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fVar4 = 1e+09 / (pVVar2->m_Properties).limits.timestampPeriod;
  uVar6 = (ulong)fVar4;
  this->m_CounterFrequency = (long)(fVar4 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
  local_60 = pRenderDeviceVk;
  pIVar7 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&pRenderDeviceVk->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CmdQueueInd);
  uVar5 = (*(pIVar7->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar7);
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>(&local_8d,uVar5);
  uVar5 = (LogicalDevice->m_SupportedStagesMask).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(byte)local_8d];
  lVar3 = *(long *)&(pVVar2->m_QueueFamilyProperties).
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl;
  lVar8 = (ulong)(byte)local_8d * 0x18;
  uVar1 = *(uint *)(lVar3 + lVar8);
  local_8c = *(int *)(lVar3 + 8 + lVar8);
  uVar9 = 0x4ff;
  if ((uVar5 & 0x40) == 0) {
    uVar9 = 0x4e7;
  }
  uVar5 = uVar5 << 4;
  this_00 = (this->m_Pools)._M_elems;
  uVar6 = 0;
LAB_002a88c7:
  do {
    do {
      uVar10 = uVar6;
      this_00 = this_00 + 1;
      if (uVar10 == 5) {
        return;
      }
      uVar6 = uVar10 + 1;
    } while (((uVar10 == 0) && ((LogicalDevice->m_EnabledFeatures).occlusionQueryPrecise == 0)) ||
            ((uVar10 == 3 && ((LogicalDevice->m_EnabledFeatures).pipelineStatisticsQuery == 0))));
    Type = (QUERY_TYPE)uVar6;
    if ((Type == QUERY_TYPE_DURATION) || (Type == QUERY_TYPE_TIMESTAMP)) goto LAB_002a8907;
  } while ((uVar1 & 1) == 0);
  goto LAB_002a8936;
LAB_002a8907:
  if ((local_8c != 0) &&
     (((uVar1 & 3) != 0 ||
      ((local_60->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
       TransferQueueTimestampQueries != DEVICE_FEATURE_STATE_DISABLED)))) {
LAB_002a8936:
    local_88.pNext = (void *)0x0;
    local_88.queryCount = 0;
    local_88.pipelineStatistics = 0;
    local_88.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
    local_88._4_4_ = 0;
    local_88.flags = 0;
    local_88.queryType = VK_QUERY_TYPE_OCCLUSION;
    switch(uVar10 & 0xffffffff) {
    case 0:
    case 1:
      break;
    case 2:
    case 4:
      local_88.flags = 0;
      local_88.queryType = VK_QUERY_TYPE_TIMESTAMP;
      break;
    case 3:
      local_88.flags = 0;
      local_88.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
      local_88._24_8_ = (ulong)(uVar5 & 0x200 | uVar5 & 0x100 | uVar9) << 0x20;
      break;
    default:
      FormatString<char[22]>(&local_50,(char (*) [22])"Unexpected query type");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"QueryManagerVk",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                 ,0xf1);
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_88.queryCount = local_58[uVar10 + 1] << (uVar10 == 4);
    Args_1 = (char (*) [108])(uVar6 & 0xffffffff);
    QueryPoolInfo::Init(this_00,LogicalDevice,&local_88,Type);
    if ((((this_00->m_vkQueryPool).m_VkObject == (VkQueryPool_T *)0x0) ||
        (this_00->m_QueryCount != local_88.queryCount)) || (uVar6 != this_00->m_Type)) {
      FormatString<char[26],char[108]>
                (&local_50,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType"
                 ,Args_1);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"QueryManagerVk",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                 ,0xfa);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  goto LAB_002a88c7;
}

Assistant:

QueryManagerVk::QueryManagerVk(RenderDeviceVkImpl* pRenderDeviceVk,
                               const Uint32        QueryHeapSizes[],
                               SoftwareQueueIndex  CmdQueueInd) :
    m_CommandQueueId{CmdQueueInd}
{
    const auto& LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();

    auto timestampPeriod = PhysicalDevice.GetProperties().limits.timestampPeriod;
    m_CounterFrequency   = static_cast<Uint64>(1000000000.0 / timestampPeriod);

    const auto  QueueFamilyIndex       = HardwareQueueIndex{pRenderDeviceVk->GetCommandQueue(CmdQueueInd).GetQueueFamilyIndex()};
    const auto& EnabledFeatures        = LogicalDevice.GetEnabledFeatures();
    const auto  StageMask              = LogicalDevice.GetSupportedStagesMask(QueueFamilyIndex);
    const auto  QueueFlags             = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].queueFlags;
    const auto& DeviceInfo             = pRenderDeviceVk->GetDeviceInfo();
    const bool  IsTransferQueue        = (QueueFlags & (VK_QUEUE_COMPUTE_BIT | VK_QUEUE_GRAPHICS_BIT)) == 0;
    const bool  QueueSupportsTimestamp = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].timestampValidBits > 0;

    for (Uint32 query_type = QUERY_TYPE_UNDEFINED + 1; query_type < QUERY_TYPE_NUM_TYPES; ++query_type)
    {
        const auto QueryType = static_cast<QUERY_TYPE>(query_type);
        if ((QueryType == QUERY_TYPE_OCCLUSION && !EnabledFeatures.occlusionQueryPrecise) ||
            (QueryType == QUERY_TYPE_PIPELINE_STATISTICS && !EnabledFeatures.pipelineStatisticsQuery))
            continue;

        // Time and duration queries are supported in all queues
        if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
        {
            if (!QueueSupportsTimestamp)
                continue;

            if (IsTransferQueue && !DeviceInfo.Features.TransferQueueTimestampQueries)
                continue; // Not supported in transfer queue
        }
        // Other queries are supported only in graphics queue
        else if ((QueueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)
            continue;


        // clang-format off
        static_assert(QUERY_TYPE_OCCLUSION          == 1, "Unexpected value of QUERY_TYPE_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_BINARY_OCCLUSION   == 2, "Unexpected value of QUERY_TYPE_BINARY_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_TIMESTAMP          == 3, "Unexpected value of QUERY_TYPE_TIMESTAMP. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_PIPELINE_STATISTICS== 4, "Unexpected value of QUERY_TYPE_PIPELINE_STATISTICS. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_DURATION           == 5, "Unexpected value of QUERY_TYPE_DURATION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_NUM_TYPES          == 6, "Unexpected value of QUERY_TYPE_NUM_TYPES. EngineVkCreateInfo::QueryPoolSizes must be updated");
        // clang-format on

        VkQueryPoolCreateInfo QueryPoolCI{};
        QueryPoolCI.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
        QueryPoolCI.pNext = nullptr;
        QueryPoolCI.flags = 0;

        static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below");
        switch (QueryType)
        {
            case QUERY_TYPE_OCCLUSION:
            case QUERY_TYPE_BINARY_OCCLUSION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_OCCLUSION;
                break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_TIMESTAMP;
                break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                QueryPoolCI.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
                QueryPoolCI.pipelineStatistics =
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT;

                if (StageMask & VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT)
                {
                    QueryPoolCI.pipelineStatistics |=
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT |
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT;
                }
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT;
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT;
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
        }

        QueryPoolCI.queryCount = QueryHeapSizes[QueryType];
        if (QueryType == QUERY_TYPE_DURATION)
            QueryPoolCI.queryCount *= 2;

        auto& PoolInfo = m_Pools[QueryType];
        PoolInfo.Init(LogicalDevice, QueryPoolCI, QueryType);
        VERIFY_EXPR(!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType);
    }
}